

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O2

void __thiscall
VW::object_pool<example,_example_initializer>::object_pool
          (object_pool<example,_example_initializer> *this,size_t initial_chunk_size,size_t param_3)

{
  *(undefined8 *)((long)&(this->m_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::queue<example*,std::deque<example*,std::allocator<example*>>>::
  queue<std::deque<example*,std::allocator<example*>>,void>(&this->m_pool);
  (this->m_chunks).
  super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chunks).
  super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_chunk_bounds).
  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_chunks).
  super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chunk_bounds).
  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chunk_bounds).
  super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_initial_chunk_size = initial_chunk_size;
  this->m_chunk_size = param_3;
  new_chunk(this,initial_chunk_size);
  return;
}

Assistant:

object_pool(size_t initial_chunk_size, TInitializer initializer = {}, size_t chunk_size = 8)
    : m_initializer(initializer),
    m_initial_chunk_size(initial_chunk_size),
    m_chunk_size(chunk_size)
  {
    new_chunk(initial_chunk_size);
  }